

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void checkstacksizes(lua_State *L,StkId max)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  int s_used;
  int ci_used;
  
  lVar1 = *(long *)(in_RDI + 0x40);
  if (*(int *)(in_RDI + 0x5c) < 0x4e21) {
    if (((int)((*(long *)(in_RDI + 0x28) - *(long *)(in_RDI + 0x50)) / 0x28) * 4 <
         *(int *)(in_RDI + 0x5c)) && (0x10 < *(int *)(in_RDI + 0x5c))) {
      luaD_reallocCI(_s_used,(int)((ulong)in_RDI >> 0x20));
    }
    if (((int)(in_RSI - lVar1 >> 4) * 4 < *(int *)(in_RDI + 0x58)) &&
       (0x5a < *(int *)(in_RDI + 0x58))) {
      luaD_reallocstack(_s_used,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

static void checkstacksizes(lua_State*L,StkId max){
int ci_used=cast_int(L->ci-L->base_ci);
int s_used=cast_int(max-L->stack);
if(L->size_ci>20000)
return;
if(4*ci_used<L->size_ci&&2*8<L->size_ci)
luaD_reallocCI(L,L->size_ci/2);
condhardstacktests(luaD_reallocCI(L,ci_used+1));
if(4*s_used<L->stacksize&&
2*((2*20)+5)<L->stacksize)
luaD_reallocstack(L,L->stacksize/2);
condhardstacktests(luaD_reallocstack(L,s_used));
}